

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Noise::run(Nes_Noise *this,nes_time_t time,nes_time_t end_time)

{
  Blip_Buffer *this_00;
  sbyte sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  blip_resampled_time_t bVar5;
  int t;
  int in_EDX;
  int in_ESI;
  Blip_Synth<8,_1> *in_RDI;
  int feedback_1;
  int tap;
  int delta_1;
  int noise;
  blip_resampled_time_t rtime;
  blip_resampled_time_t rperiod;
  Blip_Buffer *output;
  int feedback;
  int mode_flag;
  int delta;
  int amp;
  int volume;
  int period;
  int in_stack_ffffffffffffffa8;
  int t_00;
  int local_40;
  uint local_3c;
  blip_resampled_time_t local_38;
  int local_c;
  
  t = (int)noise_period_table[(int)(*(uchar *)((long)&(in_RDI->impl).buf + 2) & 0xf)];
  if (*(Blip_Buffer **)&(in_RDI->impl).last_amp == (Blip_Buffer *)0x0) {
    iVar2 = *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) + in_ESI;
    *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) =
         (iVar2 + (((in_EDX - iVar2) + t + -1) / t) * t) - in_EDX;
  }
  else {
    Blip_Buffer::set_modified(*(Blip_Buffer **)&(in_RDI->impl).last_amp);
    iVar3 = Nes_Envelope::volume((Nes_Envelope *)in_RDI);
    iVar2 = iVar3;
    if ((*(uint *)in_RDI->impulses & 1) == 0) {
      iVar2 = 0;
    }
    t_00 = iVar2;
    iVar4 = Nes_Osc::update_amp((Nes_Osc *)in_RDI,iVar2);
    if (iVar4 != 0) {
      Blip_Synth<8,_1>::offset(in_RDI,t_00,in_stack_ffffffffffffffa8,(Blip_Buffer *)0x82e77b);
    }
    local_c = *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) + in_ESI;
    if (local_c < in_EDX) {
      if (iVar3 == 0) {
        local_c = (((in_EDX - local_c) + t + -1) / t) * t + local_c;
        if (((ulong)(in_RDI->impl).buf & 0x800000) == 0) {
          *(uint *)in_RDI->impulses =
               (*(int *)in_RDI->impulses << 0xd ^ *(int *)in_RDI->impulses << 0xe) & 0x4000U |
               *(int *)in_RDI->impulses >> 1;
        }
      }
      else {
        this_00 = *(Blip_Buffer **)&(in_RDI->impl).last_amp;
        bVar5 = Blip_Buffer::resampled_duration(this_00,t);
        local_38 = Blip_Buffer::resampled_time(this_00,local_c);
        local_3c = *(uint *)in_RDI->impulses;
        local_40 = iVar2 * 2 - iVar3;
        sVar1 = 0xd;
        if (((ulong)(in_RDI->impl).buf & 0x800000) != 0) {
          sVar1 = 8;
        }
        do {
          local_c = t + local_c;
          if ((local_3c + 1 & 2) != 0) {
            local_40 = -local_40;
            Blip_Synth<8,_1>::offset_resampled
                      ((Blip_Synth<8,_1> *)(in_RDI->impulses + 4),local_38,local_40,this_00);
          }
          local_38 = bVar5 + local_38;
          local_3c = (local_3c << sVar1 ^ local_3c << 0xe) & 0x4000 | (int)local_3c >> 1;
        } while (local_c < in_EDX);
        *(int *)&(in_RDI->impl).impulses = local_40 + iVar3 >> 1;
        *(uint *)in_RDI->impulses = local_3c;
      }
    }
    *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) = local_c - in_EDX;
  }
  return;
}

Assistant:

void Nes_Noise::run( nes_time_t time, nes_time_t end_time )
{
	int period = noise_period_table [regs [2] & 15];
	
	if ( !output )
	{
		// TODO: clean up
		time += delay;
		delay = time + (end_time - time + period - 1) / period * period - end_time;
		return;
	}
	
	output->set_modified();
	
	const int volume = this->volume();
	int amp = (noise & 1) ? volume : 0;
	{
		int delta = update_amp( amp );
		if ( delta )
			synth.offset( time, delta, output );
	}
	
	time += delay;
	if ( time < end_time )
	{
		const int mode_flag = 0x80;
		
		if ( !volume )
		{
			// round to next multiple of period
			time += (end_time - time + period - 1) / period * period;
			
			// approximate noise cycling while muted, by shuffling up noise register
			// to do: precise muted noise cycling?
			if ( !(regs [2] & mode_flag) ) {
				int feedback = (noise << 13) ^ (noise << 14);
				noise = (feedback & 0x4000) | (noise >> 1);
			}
		}
		else
		{
			Blip_Buffer* const output = this->output;
			
			// using resampled time avoids conversion in synth.offset()
			blip_resampled_time_t rperiod = output->resampled_duration( period );
			blip_resampled_time_t rtime = output->resampled_time( time );
			
			int noise = this->noise;
			int delta = amp * 2 - volume;
			const int tap = (regs [2] & mode_flag ? 8 : 13);
			
			do {
				int feedback = (noise << tap) ^ (noise << 14);
				time += period;
				
				if ( (noise + 1) & 2 ) {
					// bits 0 and 1 of noise differ
					delta = -delta;
					synth.offset_resampled( rtime, delta, output );
				}
				
				rtime += rperiod;
				noise = (feedback & 0x4000) | (noise >> 1);
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->noise = noise;
		}
	}
	
	delay = time - end_time;
}